

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

void tcg_gen_gvec_ori_arm
               (TCGContext_conflict *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,int64_t c,
               uint32_t oprsz,uint32_t maxsz)

{
  ulong uVar1;
  TCGv_i64 c_00;
  long lVar2;
  uintptr_t o;
  
  switch(vece) {
  case 0:
    uVar1 = c & 0xff;
    lVar2 = 0x101010101010101;
    goto LAB_005d4139;
  case 1:
    uVar1 = c & 0xffff;
    lVar2 = 0x1000100010001;
LAB_005d4139:
    c = lVar2 * uVar1;
    break;
  case 2:
    c = c << 0x20 | c & 0xffffffffU;
    break;
  case 3:
    break;
  default:
    c = 0;
  }
  c_00 = tcg_const_i64_arm(tcg_ctx,c);
  tcg_gen_gvec_2s_arm(tcg_ctx,dofs,aofs,oprsz,maxsz,c_00,&gop_ors);
  tcg_temp_free_internal_arm(tcg_ctx,(TCGTemp *)(c_00 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_gvec_ori(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                      int64_t c, uint32_t oprsz, uint32_t maxsz)
{
    TCGv_i64 tmp = tcg_const_i64(tcg_ctx, dup_const(vece, c));
    tcg_gen_gvec_2s(tcg_ctx, dofs, aofs, oprsz, maxsz, tmp, &gop_ors);
    tcg_temp_free_i64(tcg_ctx, tmp);
}